

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnWriter::HandleDefineLevels
          (ColumnWriter *this,ColumnWriterState *state,ColumnWriterState *parent,
          ValidityMask *validity,idx_t count,uint16_t define_value,uint16_t null_value)

{
  pointer puVar1;
  bool bVar2;
  IOException *pIVar3;
  uint16_t *puVar4;
  idx_t i;
  idx_t row_idx;
  ulong uVar5;
  reference rVar6;
  uint16_t define_value_local;
  allocator local_61;
  ColumnWriter *local_60;
  idx_t local_58;
  string local_50;
  
  define_value_local = define_value;
  local_60 = this;
  if (parent == (ColumnWriterState *)0x0) {
    if ((validity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
       ) {
      ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::insert
                (&(state->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                 (const_iterator)
                 (state->definition_levels).
                 super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_finish,count,&define_value_local);
    }
    else {
      for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&validity->super_TemplatedValidityMask<unsigned_long>,row_idx);
        puVar4 = &null_value;
        if (bVar2) {
          puVar4 = &define_value_local;
        }
        ::std::vector<unsigned_short,std::allocator<unsigned_short>>::
        emplace_back<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                   &state->definition_levels,puVar4);
        state->null_count = state->null_count + (ulong)!bVar2;
      }
    }
    if ((local_60->can_have_nulls == false) && (state->null_count != 0)) {
      pIVar3 = (IOException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 "Parquet writer: map key column is not allowed to contain NULL values",&local_61);
      IOException::IOException(pIVar3,&local_50);
      __cxa_throw(pIVar3,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  else {
    local_58 = 0;
LAB_00dd1450:
    uVar5 = (long)(state->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(state->definition_levels).
                  super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                  super__Vector_impl_data._M_start;
    puVar1 = (parent->definition_levels).
             super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar5 < (ulong)((long)(parent->definition_levels).
                              super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1)) {
      if (*(short *)((long)puVar1 + uVar5) == -1) {
        bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&validity->super_TemplatedValidityMask<unsigned_long>,local_58);
        if (bVar2) {
          puVar4 = &define_value_local;
        }
        else {
          if (local_60->can_have_nulls == false) {
            pIVar3 = (IOException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_50,
                       "Parquet writer: map key column is not allowed to contain NULL values",
                       &local_61);
            IOException::IOException(pIVar3,&local_50);
            __cxa_throw(pIVar3,&IOException::typeinfo,::std::runtime_error::~runtime_error);
          }
          state->null_count = state->null_count + 1;
          puVar4 = &null_value;
        }
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (&(state->definition_levels).
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>,puVar4);
      }
      else {
        ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  (&(state->definition_levels).
                    super_vector<unsigned_short,_std::allocator<unsigned_short>_>,
                   (value_type_conflict7 *)((long)puVar1 + uVar5));
        state->parent_null_count = state->parent_null_count + 1;
      }
      if (((parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
           super__Bit_iterator_base._M_p !=
           (parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
           super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
           super__Bit_iterator_base._M_p) ||
         (*(uint *)((long)&(parent->is_empty).super_vector<bool,_std::allocator<bool>_>.
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) != 0))
      goto LAB_00dd14d6;
      goto LAB_00dd14ed;
    }
  }
  return;
LAB_00dd14d6:
  rVar6 = vector<bool,_true>::get<true>(&parent->is_empty,(long)uVar5 >> 1);
  if ((*rVar6._M_p & rVar6._M_mask) == 0) {
LAB_00dd14ed:
    local_58 = local_58 + 1;
  }
  goto LAB_00dd1450;
}

Assistant:

void ColumnWriter::HandleDefineLevels(ColumnWriterState &state, ColumnWriterState *parent, const ValidityMask &validity,
                                      const idx_t count, const uint16_t define_value, const uint16_t null_value) const {
	if (parent) {
		// parent node: inherit definition level from the parent
		idx_t vector_index = 0;
		while (state.definition_levels.size() < parent->definition_levels.size()) {
			idx_t current_index = state.definition_levels.size();
			if (parent->definition_levels[current_index] != PARQUET_DEFINE_VALID) {
				state.definition_levels.push_back(parent->definition_levels[current_index]);
				state.parent_null_count++;
			} else if (validity.RowIsValid(vector_index)) {
				state.definition_levels.push_back(define_value);
			} else {
				if (!can_have_nulls) {
					throw IOException("Parquet writer: map key column is not allowed to contain NULL values");
				}
				state.null_count++;
				state.definition_levels.push_back(null_value);
			}
			if (parent->is_empty.empty() || !parent->is_empty[current_index]) {
				vector_index++;
			}
		}
	} else {
		// no parent: set definition levels only from this validity mask
		if (validity.AllValid()) {
			state.definition_levels.insert(state.definition_levels.end(), count, define_value);
		} else {
			for (idx_t i = 0; i < count; i++) {
				const auto is_null = !validity.RowIsValid(i);
				state.definition_levels.emplace_back(is_null ? null_value : define_value);
				state.null_count += is_null;
			}
		}
		if (!can_have_nulls && state.null_count != 0) {
			throw IOException("Parquet writer: map key column is not allowed to contain NULL values");
		}
	}
}